

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O0

Code * __thiscall md::Code::andi(Code *this,ImmediateValue *value,Param *target,Size size)

{
  short sVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  uint16_t local_28;
  short local_26;
  Size local_24;
  uint16_t opcode;
  uint16_t size_code;
  Size size_local;
  Param *target_local;
  ImmediateValue *value_local;
  Code *this_local;
  
  local_26 = 0;
  if (size == WORD) {
    local_26 = 1;
  }
  else if (size == LONG) {
    local_26 = 2;
  }
  sVar1 = local_26 * 0x40;
  local_24 = size;
  _opcode = target;
  target_local = &value->super_Param;
  value_local = (ImmediateValue *)this;
  local_28 = Param::getMXn(target);
  local_28 = sVar1 + 0x200 + local_28;
  add_opcode(this,local_28);
  (*target_local->_vptr_Param[2])();
  add_bytes(this,&local_40);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_40);
  (*_opcode->_vptr_Param[2])();
  add_bytes(this,&local_68);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_68);
  return this;
}

Assistant:

Code& Code::andi(const ImmediateValue& value, const Param& target, Size size)
{
    uint16_t size_code = 0x0;
    if (size == Size::WORD)
        size_code = 0x1;
    else if (size == Size::LONG)
        size_code = 0x2;

    uint16_t opcode = 0x0200 + (size_code << 6) + target.getMXn();
    this->add_opcode(opcode);
    this->add_bytes(value.getAdditionnalData());
    this->add_bytes(target.getAdditionnalData());

    return *this;
}